

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O0

void __thiscall ncnn::PoolAllocator::PoolAllocator(PoolAllocator *this)

{
  PoolAllocatorPrivate *this_00;
  Allocator *in_RDI;
  
  in_RDI->_vptr_Allocator = (_func_int **)0x0;
  Allocator::Allocator(in_RDI);
  in_RDI->_vptr_Allocator = (_func_int **)&PTR__PoolAllocator_01fa0908;
  this_00 = (PoolAllocatorPrivate *)operator_new(0x88);
  PoolAllocatorPrivate::PoolAllocatorPrivate(this_00);
  in_RDI[1]._vptr_Allocator = (_func_int **)this_00;
  *(undefined4 *)(in_RDI[1]._vptr_Allocator + 10) = 0xc0;
  return;
}

Assistant:

PoolAllocator::PoolAllocator()
    : Allocator(), d(new PoolAllocatorPrivate)
{
    d->size_compare_ratio = 192; // 0.75f * 256
}